

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O1

void Gia_ManGlaCollect(Gia_Man_t *p,Vec_Int_t *vGateClasses,Vec_Int_t **pvPis,Vec_Int_t **pvPPis,
                      Vec_Int_t **pvFlops,Vec_Int_t **pvNodes)

{
  int iVar1;
  int Entry;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t **ppVVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0xa3,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0xa4,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  __ptr = Gia_GlaCollectAssigned(p,vGateClasses);
  if (pvPis != (Vec_Int_t **)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    *pvPis = pVVar5;
  }
  if (pvPPis != (Vec_Int_t **)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    *pvPPis = pVVar5;
  }
  if (pvFlops != (Vec_Int_t **)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    *pvFlops = pVVar5;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(4000);
    pVVar5->pArray = piVar6;
    *pvNodes = pVVar5;
  }
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    piVar6 = __ptr->pArray;
    lVar10 = 0;
    do {
      Entry = piVar6[lVar10];
      lVar8 = (long)Entry;
      if ((lVar8 < 0) || (iVar2 = p->nObjs, iVar2 <= Entry)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)(p->pObjs + lVar8);
      uVar4 = (uint)uVar3;
      uVar9 = (uint)(uVar3 >> 0x20);
      if (((uVar4 & 0x9fffffff) == 0x9fffffff) &&
         ((int)(uVar9 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
        if (pvPis != (Vec_Int_t **)0x0) {
          ppVVar7 = pvPis;
          if (iVar2 <= Entry) goto LAB_005f0585;
LAB_005f050e:
          Vec_IntPush(*ppVVar7,Entry);
        }
      }
      else {
        if (iVar2 <= Entry) {
LAB_005f0585:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (vGateClasses->nSize <= Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        ppVVar7 = pvPPis;
        if ((vGateClasses->pArray[lVar8] == 0) ||
           ((((uVar4 & 0x9fffffff) == 0x9fffffff &&
             (ppVVar7 = pvFlops, p->vCis->nSize - p->nRegs <= (int)(uVar9 & 0x1fffffff))) ||
            (ppVVar7 = pvNodes, (~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4)))) {
          if (ppVVar7 != (Vec_Int_t **)0x0) goto LAB_005f050e;
        }
        else if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                        ,0xb6,
                        "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                       );
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar1 != lVar10);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManGlaCollect( Gia_Man_t * p, Vec_Int_t * vGateClasses, Vec_Int_t ** pvPis, Vec_Int_t ** pvPPis, Vec_Int_t ** pvFlops, Vec_Int_t ** pvNodes )
{ 
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );
    // create included objects and their fanins
    vAssigned = Gia_GlaCollectAssigned( p, vGateClasses );
    // create additional arrays
    if ( pvPis )   *pvPis   = Vec_IntAlloc( 100 );
    if ( pvPPis )  *pvPPis  = Vec_IntAlloc( 100 );
    if ( pvFlops ) *pvFlops = Vec_IntAlloc( 100 );
    if ( pvNodes ) *pvNodes = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( vAssigned, p, pObj, i )
    {
        if ( Gia_ObjIsPi(p, pObj) )
            { if ( pvPis )   Vec_IntPush( *pvPis, Gia_ObjId(p,pObj) );   }
        else if ( !Vec_IntEntry(vGateClasses, Gia_ObjId(p,pObj)) )
            { if ( pvPPis )  Vec_IntPush( *pvPPis, Gia_ObjId(p,pObj) );  }
        else if ( Gia_ObjIsRo(p, pObj) )
            { if ( pvFlops ) Vec_IntPush( *pvFlops, Gia_ObjId(p,pObj) ); }
        else if ( Gia_ObjIsAnd(pObj) )
            { if ( pvNodes ) Vec_IntPush( *pvNodes, Gia_ObjId(p,pObj) ); }
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntFree( vAssigned );
}